

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_sse2.c
# Opt level: O3

void DC8uv_SSE2(uint8_t *dst)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 uVar8;
  undefined1 uVar9;
  
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(dst + -0x20);
  iVar2 = 0;
  lVar5 = -1;
  do {
    iVar2 = iVar2 + (uint)dst[lVar5];
    lVar5 = lVar5 + 0x20;
  } while (lVar5 != 0xff);
  auVar6 = psadbw(auVar6,(undefined1  [16])0x0);
  uVar3 = iVar2 + auVar6._0_4_ + 8;
  uVar4 = uVar3 >> 4;
  bVar1 = (byte)(uVar3 >> 0x18);
  uVar9 = (undefined1)(uVar4 >> 0x10);
  uVar8 = (undefined1)(uVar4 >> 8);
  auVar7._4_4_ = (int)(CONCAT35(CONCAT21(CONCAT11(bVar1 >> 4,bVar1 >> 4),uVar9),
                                CONCAT14(uVar9,uVar4)) >> 0x20);
  auVar7[3] = uVar8;
  auVar7[2] = uVar8;
  auVar7[0] = (undefined1)uVar4;
  auVar7[1] = auVar7[0];
  auVar7._8_8_ = 0;
  auVar6 = pshuflw(auVar7,auVar7,0);
  lVar5 = 0;
  do {
    *(long *)(dst + lVar5) = auVar6._0_8_;
    lVar5 = lVar5 + 0x20;
  } while (lVar5 != 0x100);
  return;
}

Assistant:

static void DC8uv_SSE2(uint8_t* dst) {     // DC
  const __m128i zero = _mm_setzero_si128();
  const __m128i top = _mm_loadl_epi64((const __m128i*)(dst - BPS));
  const __m128i sum = _mm_sad_epu8(top, zero);
  int left = 0;
  int j;
  for (j = 0; j < 8; ++j) {
    left += dst[-1 + j * BPS];
  }
  {
    const int DC = _mm_cvtsi128_si32(sum) + left + 8;
    Put8x8uv_SSE2(DC >> 4, dst);
  }
}